

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_935bd6::HandleReadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  long *plVar6;
  byte bVar7;
  _Ios_Seekdir _Var8;
  _Alloc_hider sizeLimit;
  string_view value;
  static_string_view name;
  static_string_view name_00;
  string_view name_01;
  string output;
  string error;
  string fileName;
  Arguments arguments;
  char hex [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  string local_258 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  ifstream file;
  byte local_218 [8];
  _Manager_type p_Stack_210;
  _Invoker_type local_208;
  undefined1 auStack_200 [8];
  _Function_base local_1f8;
  pointer ppStack_1e0;
  pointer local_1d8;
  pointer ppStack_1d0;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"READ must be called with at least two additional arguments",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&file);
    bVar2 = false;
  }
  else {
    if (((anonymous_namespace)::
         HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar4 != 0)) {
      local_1d8 = (pointer)0x0;
      ppStack_1d0 = (pointer)0x0;
      local_1f8._M_manager = (_Manager_type)0x0;
      ppStack_1e0 = (pointer)0x0;
      local_1f8._M_functor._0_8_ = 0;
      local_1f8._M_functor._8_8_ = 0;
      local_208 = (_Invoker_type)0x0;
      auStack_200 = (undefined1  [8])0x0;
      local_218[0] = 0;
      local_218[1] = 0;
      local_218[2] = 0;
      local_218[3] = 0;
      local_218[4] = 0;
      local_218[5] = 0;
      local_218[6] = 0;
      local_218[7] = 0;
      p_Stack_210 = (_Manager_type)0x0;
      _file = (cmArgumentParser<Arguments> *)0x0;
      name.super_string_view._M_str = "OFFSET";
      name.super_string_view._M_len = 6;
      cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&file,name,0);
      name_00.super_string_view._M_str = "LIMIT";
      name_00.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&file,name_00,0x20);
      arguments.Offset._M_string_length = 0;
      arguments.Offset._M_dataplus._M_p = (pointer)0x40;
      arguments.Offset.field_2._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_invoke;
      arguments.Offset.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_manager;
      name_01._M_str = "HEX";
      name_01._M_len = 3;
      ArgumentParser::Base::Bind((Base *)&file,name_01,(KeywordAction *)&arguments);
      std::_Function_base::~_Function_base((_Function_base *)&arguments);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleReadCommand::parser,(ActionMap *)&file);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&file);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleReadCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    output._M_string_length =
         (size_type)
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    output._M_dataplus._M_p =
         (pointer)((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3);
    arguments.Offset._M_dataplus._M_p = (pointer)&arguments.Offset.field_2;
    arguments.Offset._M_string_length = 0;
    arguments.Offset.field_2._M_allocated_capacity =
         arguments.Offset.field_2._M_allocated_capacity & 0xffffffffffffff00;
    arguments.Limit._M_dataplus._M_p = (pointer)&arguments.Limit.field_2;
    arguments.Limit._M_string_length = 0;
    arguments.Limit.field_2._M_local_buf[0] = '\0';
    arguments.Hex = false;
    _file = &HandleReadCommand::parser;
    local_218[0] = 0;
    local_218[1] = 0;
    local_218[2] = 0;
    local_218[3] = 0;
    local_218[4] = 0;
    local_218[5] = 0;
    local_218[6] = 0;
    local_218[7] = 0;
    p_Stack_210 = (_Manager_type)0x0;
    local_208 = (_Invoker_type)0x0;
    auStack_200 = (undefined1  [8])0x0;
    local_1f8._M_functor._0_8_ = 0;
    local_1f8._M_functor._8_8_ = 0;
    local_1f8._M_manager = (_Manager_type)0x0;
    ppStack_1e0 = (pointer)0x0;
    local_1d8 = (pointer)((ulong)local_1d8 & 0xffffffffffffff00);
    ArgumentParser::Instance::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Instance *)&file,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&output,0);
    std::_Function_base::~_Function_base(&local_1f8);
    std::__cxx11::string::string((string *)&fileName,(string *)(pbVar1 + 1));
    bVar2 = cmsys::SystemTools::FileIsFullPath(&fileName);
    if (!bVar2) {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      _file = (cmArgumentParser<Arguments> *)psVar5->_M_string_length;
      output._M_string_length = (size_type)&output.field_2;
      output._M_dataplus._M_p = (pointer)0x1;
      output.field_2._M_local_buf[0] = '/';
      cmStrCat<std::__cxx11::string>
                ((string *)hex,(cmAlphaNum *)&file,(cmAlphaNum *)&output,pbVar1 + 1);
      std::__cxx11::string::operator=((string *)&fileName,(string *)hex);
      std::__cxx11::string::~string((string *)hex);
    }
    std::ifstream::ifstream(&file,fileName._M_dataplus._M_p,_S_in);
    bVar2 = (local_218[(long)((ActionMap *)_file)[-1].Positions.
                             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             .
                             super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start] & 5) == 0;
    if (bVar2) {
      if ((arguments.Limit._M_string_length == 0) ||
         (bVar3 = cmStrToULongLong(&arguments.Limit,(unsigned_long_long *)&output),
         sizeLimit = output._M_dataplus, !bVar3)) {
        sizeLimit._M_p = (pointer)0xffffffffffffffff;
      }
      if ((arguments.Offset._M_string_length == 0) ||
         (bVar3 = cmStrToLongLong(&arguments.Offset,(longlong *)&output), !bVar3)) {
        _Var8 = _S_beg;
      }
      else {
        _Var8 = (_Ios_Seekdir)output._M_dataplus._M_p;
      }
      std::istream::seekg((long)&file,_Var8);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      if (arguments.Hex == true) {
        while ((bVar3 = sizeLimit._M_p != (pointer)0x0, sizeLimit._M_p = sizeLimit._M_p + -1, bVar3
               && (plVar6 = (long *)std::istream::get((char *)&file),
                  (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0))) {
          snprintf(hex,4,"%.2x",(ulong)(byte)error._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&output);
        }
      }
      else {
        _hex = (pointer)local_278;
        local_278[0]._M_local_buf[0] = '\0';
        error._M_dataplus._M_p._0_1_ = 0;
        while ((sizeLimit._M_p != (pointer)0x0 &&
               (bVar3 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&file,(string *)hex,(bool *)&error,
                                   (size_type)sizeLimit._M_p), bVar3))) {
          bVar7 = sizeLimit._M_p != (pointer)0x0 & (byte)error._M_dataplus._M_p;
          std::__cxx11::string::append((string *)&output);
          sizeLimit._M_p = sizeLimit._M_p + -(ulong)bVar7;
          if ((byte)error._M_dataplus._M_p == 1) {
            std::__cxx11::string::append((char *)&output);
          }
        }
        std::__cxx11::string::~string((string *)hex);
      }
      value._M_str = output._M_dataplus._M_p;
      value._M_len = output._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,pbVar1 + 2,value);
      psVar5 = &output;
    }
    else {
      output._M_dataplus._M_p = (pointer)0x1c;
      output._M_string_length = (size_type)anon_var_dwarf_64a98c;
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      _hex = (pointer)local_250;
      cmStrCat<char[6],std::__cxx11::string>
                (&error,(cmAlphaNum *)&output,(cmAlphaNum *)hex,(char (*) [6])"):\n  ",&fileName);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      psVar5 = &error;
    }
    std::__cxx11::string::~string((string *)psVar5);
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&fileName);
    HandleReadCommand::Arguments::~Arguments(&arguments);
  }
  return bVar2;
}

Assistant:

bool HandleReadCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("READ must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3),
                                           /*unparsedArguments=*/nullptr);

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/',
                        fileNameArg);
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error =
      cmStrCat("failed to open for reading (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }

  // is there a limit?
  std::string::size_type sizeLimit = std::string::npos;
  if (!arguments.Limit.empty()) {
    unsigned long long limit;
    if (cmStrToULongLong(arguments.Limit, &limit)) {
      sizeLimit = static_cast<std::string::size_type>(limit);
    }
  }

  // is there an offset?
  cmsys::ifstream::off_type offset = 0;
  if (!arguments.Offset.empty()) {
    long long off;
    if (cmStrToLongLong(arguments.Offset, &off)) {
      offset = static_cast<cmsys::ifstream::off_type>(off);
    }
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit > 0) && (file.get(c))) {
      char hex[4];
      snprintf(hex, sizeof(hex), "%.2x", c & 0xff);
      output += hex;
      sizeLimit--;
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit > 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      sizeLimit = sizeLimit - line.size();
      if (has_newline && sizeLimit > 0) {
        sizeLimit--;
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  status.GetMakefile().AddDefinition(variable, output);
  return true;
}